

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_info::torrent_info
          (torrent_info *this,bdecode_node *torrent_file,load_torrent_limits *cfg)

{
  sha1_hash *psVar1;
  sha256_hash *psVar2;
  bool bVar3;
  error_code ec;
  error_code local_40;
  
  file_storage::file_storage(&this->m_files);
  memset(&this->m_orig_files,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_info_dict).m_root_tokens = (bdecode_token *)0x0;
  *(undefined8 *)((long)&(this->m_info_dict).m_root_tokens + 4) = 0;
  *(undefined8 *)((long)&(this->m_info_dict).m_buffer + 4) = 0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  (this->m_info_hash).v1.m_number._M_elems[0] = 0;
  (this->m_info_hash).v1.m_number._M_elems[1] = 0;
  psVar1 = &(this->m_info_hash).v1;
  (psVar1->m_number)._M_elems[2] = 0;
  (psVar1->m_number)._M_elems[3] = 0;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[1] = 0;
  (psVar2->m_number)._M_elems[2] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[3] = 0;
  (psVar2->m_number)._M_elems[4] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[5] = 0;
  (psVar2->m_number)._M_elems[6] = 0;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 7) = 0;
  *(undefined8 *)((long)&this->m_piece_hashes + 1) = 0;
  local_40.val_ = 0;
  local_40.failed_ = false;
  local_40.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  bVar3 = parse_torrent_file(this,torrent_file,&local_40,cfg);
  if (bVar3) {
    return;
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_40);
}

Assistant:

torrent_info::torrent_info(bdecode_node const& torrent_file
		, load_torrent_limits const& cfg)
	{
		error_code ec;
		if (!parse_torrent_file(torrent_file, ec, cfg))
			aux::throw_ex<system_error>(ec);

		INVARIANT_CHECK;
	}